

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<kj::String>::setCapacity(Vector<kj::String> *this,size_t newSize)

{
  char (*pacVar1) [7];
  RemoveConst<kj::String>_conflict *pacVar2;
  char (*pacVar3) [7];
  ulong uVar4;
  char *pcVar5;
  __off_t in_RDX;
  ArrayBuilder<kj::String>_conflict newBuilder;
  ArrayBuilder<kj::String>_conflict local_38;
  
  uVar4 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    ArrayBuilder<kj::String>::truncate((ArrayBuilder<kj::String> *)this,(char *)newSize,in_RDX);
  }
  local_38.ptr = (char (*) [7])
                 _::HeapArrayDisposer::allocateImpl
                           (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = (char (*) [7])((long)local_38.ptr + newSize * 0x18);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pacVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pcVar5 = *(this->builder).ptr; (char (*) [7])pcVar5 != pacVar1; pcVar5 = pcVar5 + 0x18) {
    *(undefined8 *)local_38.pos = *(undefined8 *)pcVar5;
    *(undefined8 *)(*(char (*) [7])((long)local_38.pos + 7) + 1) = *(undefined8 *)(pcVar5 + 8);
    *(undefined8 *)(*(char (*) [7])((long)local_38.pos + 0xe) + 2) = *(undefined8 *)(pcVar5 + 0x10);
    local_38.pos = (RemoveConst<kj::String>_conflict *)
                   (*(char (*) [7])((long)local_38.pos + 0x15) + 3);
    *(undefined8 *)pcVar5 = 0;
    *(undefined8 *)(pcVar5 + 8) = 0;
  }
  ArrayBuilder<kj::String>::operator=((ArrayBuilder<kj::String> *)this,&local_38);
  pacVar3 = local_38.endPtr;
  pacVar2 = local_38.pos;
  pacVar1 = local_38.ptr;
  if (local_38.ptr != (char (*) [7])0x0) {
    local_38.ptr = (char (*) [7])0x0;
    local_38.pos = (RemoveConst<kj::String>_conflict *)0x0;
    local_38.endPtr = (char (*) [7])0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pacVar1,0x18,
               ((long)pacVar2 - (long)pacVar1 >> 3) * -0x5555555555555555,
               ((long)pacVar3 - (long)pacVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }